

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O1

DdNode * Cudd_bddConstrain(DdManager *dd,DdNode *f,DdNode *c)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddBddConstrainRecur(dd,f,c);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddConstrain(
  DdManager * dd,
  DdNode * f,
  DdNode * c)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddBddConstrainRecur(dd,f,c);
    } while (dd->reordered == 1);
    return(res);

}